

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O1

bool __thiscall
bv::internal::bt_impl<2048UL,_(bv::allocation_policy_t)0>::subtree_ref_base<false>::is_full
          (subtree_ref_base<false> *this)

{
  size_t index;
  long lVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  
  index = this->_size;
  if (this->_height != 0) {
    if (index == 0) {
      lVar1 = 0;
    }
    else {
      pVar2 = find_insert_point(this,index);
      lVar1 = pVar2.first + 1;
    }
    return lVar1 == this->_vector->degree + 1;
  }
  return index == 0x800;
}

Assistant:

bool is_leaf() const { return _height == 0; }